

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

string * ZXing::DataMatrix::ToHexString_abi_cxx11_(int c)

{
  undefined1 *puVar1;
  char *pcVar2;
  uint in_ESI;
  string *in_RDI;
  char *digits;
  string *val;
  allocator<char> *in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffffa7;
  char cVar3;
  size_type in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_1a;
  undefined1 local_19;
  char *local_18;
  uint local_c;
  
  local_18 = "0123456789abcdef";
  local_19 = 0;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,
             in_stack_ffffffffffffff98);
  std::allocator<char>::~allocator(&local_1a);
  puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *puVar1 = 0x78;
  cVar3 = local_18[local_c >> 4 & 0xf];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *pcVar2 = cVar3;
  cVar3 = local_18[local_c & 0xf];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *pcVar2 = cVar3;
  return in_RDI;
}

Assistant:

static std::string ToHexString(int c)
{
	const char* digits = "0123456789abcdef";
	std::string val(4, '0');
	val[1] = 'x';
	val[2] = digits[(c >> 4) & 0xf];
	val[3] = digits[c & 0xf];
	return val;
}